

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_miniscript_or_b
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  size_t local_58;
  size_t indexes [2];
  uchar append;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  indexes[1]._7_1_ = 0x9b;
  local_58 = 0;
  indexes[0] = 1;
  iVar1 = generate_by_miniscript_concat
                    (node,parent,derive_child_num,2,&local_58,(uchar *)0x0,0,(uchar *)0x0,0,
                     (uchar *)0x0,0,(uchar *)((long)indexes + 0xf),1,script,script_len,write_len);
  return iVar1;
}

Assistant:

static int generate_by_miniscript_or_b(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    unsigned char append = OP_BOOLOR;
    const size_t indexes[] = {0, 1};
    /* [X] [Y] OP_BOOLOR */
    return generate_by_miniscript_concat(
        node,
        parent,
        derive_child_num,
        2,
        indexes,
        NULL,
        0,
        NULL,
        0,
        NULL,
        0,
        &append,
        1,
        script,
        script_len,
        write_len);
}